

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

void RunVmPass(ExpressionContext *ctx,VmModule *module,VmPassType type)

{
  ExpressionContext *function;
  int iVar1;
  ExpressionContext *ctx_00;
  IntrusiveList<VmFunction> *pIVar2;
  TraceScope traceScope;
  
  if ((RunVmPass(ExpressionContext&,VmModule*,VmPassType)::token == '\0') &&
     (iVar1 = __cxa_guard_acquire(&RunVmPass(ExpressionContext&,VmModule*,VmPassType)::token),
     iVar1 != 0)) {
    RunVmPass::token = NULLC::TraceGetToken("InstructionTreeVm","RunVmPass");
    __cxa_guard_release(&RunVmPass(ExpressionContext&,VmModule*,VmPassType)::token);
  }
  ctx_00 = (ExpressionContext *)&stack0xffffffffffffffc0;
  NULLC::TraceScope::TraceScope((TraceScope *)ctx_00,RunVmPass::token);
  if (type < (VM_PASS_LEGALIZE_EXTRACTS|VM_PASS_OPT_CONSTANT_PROPAGATION)) {
    ctx_00 = (ExpressionContext *)(&DAT_00333e60 + *(int *)(&DAT_00333e60 + (ulong)type * 4));
    NULLC::TraceLabel((char *)ctx_00);
  }
  pIVar2 = &module->functions;
  while (function = (ExpressionContext *)pIVar2->head, function != (ExpressionContext *)0x0) {
    if ((function->uniqueDependencies).little[0x11] != (ModuleData *)0x0) {
      switch((ulong)type) {
      case 0:
        RunPeepholeOptimizations(ctx,module,(VmValue *)function);
        break;
      case 1:
        RunConstantPropagation(ctx,module,(VmValue *)function,false);
        break;
      case 2:
        RunDeadCodeElimiation(ctx,module,(VmFunction *)function);
        break;
      case 3:
        RunControlFlowOptimization(ctx_00,module,(VmValue *)function);
        break;
      case 4:
        RunLoadStorePropagation(ctx,module,(VmValue *)function);
        break;
      case 5:
        RunCommonSubexpressionElimination(ctx,module,(VmValue *)function);
        break;
      case 6:
        RunDeadAlocaStoreElimination(ctx,module,(VmValue *)function);
        break;
      case 7:
        RunMemoryToRegister(ctx,module,(VmValue *)function);
        break;
      case 8:
        RunArrayToElements(ctx,module,(VmValue *)function);
        break;
      case 9:
        RunLatePeepholeOptimizations(ctx,module,(VmValue *)function);
        break;
      case 10:
        RunFunctionInlining(ctx,module,(VmValue *)function);
        break;
      case 0xb:
        RunUpdateLiveSets(ctx_00,module,(VmValue *)function);
        break;
      case 0xc:
        RunPrepareSsaExit(ctx,module,(VmValue *)function);
        break;
      case 0xd:
        RunCreateAllocaStorage(ctx,module,(VmValue *)function);
        break;
      case 0xe:
        RunLegalizeArrayValues(ctx,module,(VmValue *)function);
        break;
      case 0xf:
        RunLegalizeBitcasts(ctx,module,(VmValue *)function);
        break;
      case 0x10:
        RunLegalizeExtracts(ctx,module,(VmValue *)function);
      }
      ctx_00 = function;
      VmFunction::MoveEntryBlockToStart((VmFunction *)function);
    }
    pIVar2 = (IntrusiveList<VmFunction> *)((function->uniqueDependencies).little + 0x14);
  }
  NULLC::TraceScope::~TraceScope((TraceScope *)&stack0xffffffffffffffc0);
  return;
}

Assistant:

void RunVmPass(ExpressionContext &ctx, VmModule *module, VmPassType type)
{
	TRACE_SCOPE("InstructionTreeVm", "RunVmPass");

	switch(type)
	{
	case VM_PASS_OPT_PEEPHOLE:
		TRACE_LABEL("VM_PASS_OPT_PEEPHOLE");
		break;
	case VM_PASS_OPT_CONSTANT_PROPAGATION:
		TRACE_LABEL("VM_PASS_OPT_CONSTANT_PROPAGATION");
		break;
	case VM_PASS_OPT_DEAD_CODE_ELIMINATION:
		TRACE_LABEL("VM_PASS_OPT_DEAD_CODE_ELIMINATION");
		break;
	case VM_PASS_OPT_CONTROL_FLOW_SIPLIFICATION:
		TRACE_LABEL("VM_PASS_OPT_CONTROL_FLOW_SIPLIFICATION");
		break;
	case VM_PASS_OPT_LOAD_STORE_PROPAGATION:
		TRACE_LABEL("VM_PASS_OPT_LOAD_STORE_PROPAGATION");
		break;
	case VM_PASS_OPT_COMMON_SUBEXPRESSION_ELIMINATION:
		TRACE_LABEL("VM_PASS_OPT_COMMON_SUBEXPRESSION_ELIMINATION");
		break;
	case VM_PASS_OPT_DEAD_ALLOCA_STORE_ELIMINATION:
		TRACE_LABEL("VM_PASS_OPT_DEAD_ALLOCA_STORE_ELIMINATION");
		break;
	case VM_PASS_OPT_MEMORY_TO_REGISTER:
		TRACE_LABEL("VM_PASS_OPT_MEMORY_TO_REGISTER");
		break;
	case VM_PASS_OPT_ARRAY_TO_ELEMENTS:
		TRACE_LABEL("VM_PASS_OPT_ARRAY_TO_ELEMENTS");
		break;
	case VM_PASS_OPT_LATE_PEEPHOLE:
		TRACE_LABEL("VM_PASS_OPT_LATE_PEEPHOLE");
		break;
	case VM_PASS_OPT_FUNCION_INLINING:
		TRACE_LABEL("VM_PASS_OPT_FUNCION_INLINING");
		break;
	case VM_PASS_UPDATE_LIVE_SETS:
		TRACE_LABEL("VM_PASS_UPDATE_LIVE_SETS");
		break;
	case VM_PASS_PREPARE_SSA_EXIT:
		TRACE_LABEL("VM_PASS_PREPARE_SSA_EXIT");
		break;
	case VM_PASS_CREATE_ALLOCA_STORAGE:
		TRACE_LABEL("VM_PASS_CREATE_ALLOCA_STORAGE");
		break;
	case VM_PASS_LEGALIZE_ARRAY_VALUES:
		TRACE_LABEL("VM_PASS_LEGALIZE_ARRAY_VALUES");
		break;
	case VM_PASS_LEGALIZE_BITCASTS:
		TRACE_LABEL("VM_PASS_LEGALIZE_BITCASTS");
		break;
	case VM_PASS_LEGALIZE_EXTRACTS:
		TRACE_LABEL("VM_PASS_LEGALIZE_EXTRACTS");
		break;
	}

	for(VmFunction *value = module->functions.head; value; value = value->next)
	{
		if(!value->firstBlock)
			continue;

		switch(type)
		{
		case VM_PASS_OPT_PEEPHOLE:
			RunPeepholeOptimizations(ctx, module, value);
			break;
		case VM_PASS_OPT_CONSTANT_PROPAGATION:
			RunConstantPropagation(ctx, module, value, false);
			break;
		case VM_PASS_OPT_DEAD_CODE_ELIMINATION:
			RunDeadCodeElimiation(ctx, module, value);
			break;
		case VM_PASS_OPT_CONTROL_FLOW_SIPLIFICATION:
			RunControlFlowOptimization(ctx, module, value);
			break;
		case VM_PASS_OPT_LOAD_STORE_PROPAGATION:
			RunLoadStorePropagation(ctx, module, value);
			break;
		case VM_PASS_OPT_COMMON_SUBEXPRESSION_ELIMINATION:
			RunCommonSubexpressionElimination(ctx, module, value);
			break;
		case VM_PASS_OPT_DEAD_ALLOCA_STORE_ELIMINATION:
			RunDeadAlocaStoreElimination(ctx, module, value);
			break;
		case VM_PASS_OPT_MEMORY_TO_REGISTER:
			RunMemoryToRegister(ctx, module, value);
			break;
		case VM_PASS_OPT_ARRAY_TO_ELEMENTS:
			RunArrayToElements(ctx, module, value);
			break;
		case VM_PASS_OPT_LATE_PEEPHOLE:
			RunLatePeepholeOptimizations(ctx, module, value);
			break;
		case VM_PASS_OPT_FUNCION_INLINING:
			RunFunctionInlining(ctx, module, value);
			break;
		case VM_PASS_UPDATE_LIVE_SETS:
			RunUpdateLiveSets(ctx, module, value);
			break;
		case VM_PASS_PREPARE_SSA_EXIT:
			RunPrepareSsaExit(ctx, module, value);
			break;
		case VM_PASS_CREATE_ALLOCA_STORAGE:
			RunCreateAllocaStorage(ctx, module, value);
			break;
		case VM_PASS_LEGALIZE_ARRAY_VALUES:
			RunLegalizeArrayValues(ctx, module, value);
			break;
		case VM_PASS_LEGALIZE_BITCASTS:
			RunLegalizeBitcasts(ctx, module, value);
			break;
		case VM_PASS_LEGALIZE_EXTRACTS:
			RunLegalizeExtracts(ctx, module, value);
			break;
		}

		// Preserve entry block order for execution
		value->MoveEntryBlockToStart();
	}
}